

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic3_tree.c
# Opt level: O3

int reconstructSeeds(tree_t *tree,uint16_t *hideList,size_t hideListSize,uint8_t *input,
                    size_t inputLen,uint8_t *salt,uint repIndex,picnic_instance_t *params)

{
  uint uVar1;
  size_t sVar2;
  uint *__ptr;
  size_t __n;
  int iVar3;
  size_t sVar4;
  size_t local_38;
  
  local_38 = 0;
  __ptr = getRevealedNodes(tree,hideList,hideListSize,&local_38);
  sVar2 = local_38;
  iVar3 = -1;
  if (__ptr != (uint *)0x0) {
    __n = (size_t)params->seed_size;
    if (local_38 * __n < inputLen || local_38 * __n - inputLen == 0) {
      if (local_38 != 0) {
        sVar4 = 0;
        do {
          uVar1 = __ptr[sVar4];
          memcpy(tree->nodes + uVar1 * (int)__n,input,__n);
          uVar1 = uVar1 * 2;
          sVar4 = sVar4 + 1;
          tree->haveNodeExists[uVar1 >> 6] =
               tree->haveNodeExists[uVar1 >> 6] | 1L << ((ulong)(uVar1 + 1) & 0x3f);
          __n = (size_t)params->seed_size;
          input = input + __n;
        } while (sVar2 != sVar4);
      }
      expandSeeds(tree,salt,repIndex,params);
      iVar3 = 0;
    }
  }
  free(__ptr);
  return iVar3;
}

Assistant:

int reconstructSeeds(tree_t* tree, uint16_t* hideList, size_t hideListSize, uint8_t* input,
                     size_t inputLen, uint8_t* salt, unsigned int repIndex,
                     const picnic_instance_t* params) {
  int ret                = -1;
  size_t revealedSize    = 0;
  unsigned int* revealed = getRevealedNodes(tree, hideList, hideListSize, &revealedSize);
  if (!revealed || inputLen < revealedSize * params->seed_size) {
    goto Exit;
  }

  for (size_t i = 0; i < revealedSize; i++) {
    memcpy(&tree->nodes[revealed[i] * params->seed_size], input, params->seed_size);
    markNode(tree, revealed[i]);
    input += params->seed_size;
  }

  expandSeeds(tree, salt, repIndex, params);
  ret = 0;

Exit:
  free(revealed);
  return ret;
}